

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

void __thiscall
libtorrent::piece_picker::record_downloading_piece(piece_picker *this,piece_index_t p)

{
  bool bVar1;
  bool bVar2;
  uchar uVar3;
  uchar uVar4;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> rhs;
  int iVar5;
  int iVar6;
  iterator __first;
  iterator __last;
  value_type *this_00;
  size_type sVar7;
  strong_typedef local_7d;
  int local_7c;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_78;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_74;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> piece;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> local_68
  ;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> __end1;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> __begin1
  ;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *__range1;
  bool have_all;
  iterator iStack_40;
  download_priority_t this_prio;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>_>
  local_28;
  int local_20;
  strong_typedef<int,_libtorrent::piece_extent_tag,_void> local_1c;
  piece_picker *ppStack_18;
  piece_extent_t this_extent;
  piece_picker *this_local;
  piece_index_t p_local;
  
  if (this->m_blocks_per_piece < 0x100) {
    local_20 = p.m_val;
    ppStack_18 = this;
    this_local._4_4_ = p.m_val;
    local_1c.m_val = (int)extent_for(this,p);
    __first = std::
              vector<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>
              ::begin(&this->m_recent_extents);
    __last = std::
             vector<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>
             ::end(&this->m_recent_extents);
    local_28 = std::
               find<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::piece_extent_tag,void>*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::piece_extent_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::piece_extent_tag,void>>>>,libtorrent::aux::strong_typedef<int,libtorrent::piece_extent_tag,void>>
                         ((__normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>_>
                           )__first._M_current,
                          (__normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>_>
                           )__last._M_current,&local_1c);
    iStack_40 = std::
                vector<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>
                ::end(&this->m_recent_extents);
    bVar1 = __gnu_cxx::operator!=(&local_28,&stack0xffffffffffffffc0);
    if (!bVar1) {
      have_all = (bool)piece_priority(this,this_local._4_4_);
      bVar1 = true;
      __end1.m_idx.m_val =
           (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)
           (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)local_1c.m_val;
      ___begin1 = extent_for(this,(piece_extent_t)local_1c.m_val);
      local_68 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                 ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                          *)&__begin1);
      rhs = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
            ::end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                   *)&__begin1);
      while( true ) {
        piece = local_68.m_idx.m_val;
        local_74 = rhs.m_idx.m_val;
        bVar2 = libtorrent::operator!=(local_68,rhs);
        if (!bVar2) break;
        local_78 = index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                   ::operator*(&local_68);
        iVar5 = libtorrent::aux::strong_typedef::operator_cast_to_int((strong_typedef *)&local_78);
        iVar6 = libtorrent::aux::strong_typedef::operator_cast_to_int
                          ((strong_typedef *)((long)&this_local + 4));
        if (iVar5 != iVar6) {
          local_7c = local_78.m_val;
          this_00 = libtorrent::aux::
                    container_wrapper<libtorrent::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>_>
                    ::operator[](&this->m_piece_map,local_78);
          bVar2 = piece_pos::have(this_00);
          if (!bVar2) {
            bVar1 = false;
          }
          local_7d = (strong_typedef)piece_priority(this,(piece_index_t)local_78.m_val);
          uVar3 = libtorrent::aux::strong_typedef::operator_cast_to_unsigned_char(&local_7d);
          uVar4 = libtorrent::aux::strong_typedef::operator_cast_to_unsigned_char
                            ((strong_typedef *)&have_all);
          if (uVar3 != uVar4) {
            return;
          }
        }
        index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
        operator++(&local_68);
      }
      if ((!bVar1) &&
         (sVar7 = std::
                  vector<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>
                  ::size(&this->m_recent_extents), sVar7 < 5)) {
        std::
        vector<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::piece_extent_tag,_void>_>_>
        ::push_back(&this->m_recent_extents,&local_1c);
      }
    }
  }
  return;
}

Assistant:

void piece_picker::record_downloading_piece(piece_index_t const p)
	{
		// if a single piece is large enough, don't bother with the affinity of
		// adjecent pieces.
		if (m_blocks_per_piece >= max_piece_affinity_extent) return;

		piece_extent_t const this_extent = extent_for(p);

		// if the extent is already in the list, nothing to do
		if (std::find(m_recent_extents.begin()
			, m_recent_extents.end(), this_extent) != m_recent_extents.end())
			return;

		download_priority_t const this_prio = piece_priority(p);

		// figure out if it's worth recording this downloading piece
		// if we already have all blocks in this extent, there's no point in
		// adding it
		bool have_all = true;

		for (auto const piece : extent_for(this_extent))
		{
			if (piece == p) continue;

			if (!m_piece_map[piece].have()) have_all = false;

			// if at least one piece in this extent has a different priority than
			// the one we just started downloading, don't create an affinity for
			// adjecent pieces. This probably means the pieces belong to different
			// files, or that some other mechanism determining the priority should
			// take precedence.
			if (piece_priority(piece) != this_prio) return;
		}

		// if we already have all the *other* pieces in this extent, there's no
		// need to inflate their priorities
		if (have_all) return;

		// TODO: should 5 be configurable?
		if (m_recent_extents.size() < 5)
			m_recent_extents.push_back(this_extent);

		// limit the number of extent affinities active at any given time to limit
		// the cost of checking them. Also, don't replace them, commit to
		// finishing them before starting another extent. This is analoguous to
		// limiting the number of partial pieces.
	}